

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCare.c
# Opt level: O0

Abc_Cex_t * Bmc_CexCareExtendToObjects(Gia_Man_t *p,Abc_Cex_t *pCex,Abc_Cex_t *pCexCare)

{
  int nRealPis;
  int iVar1;
  Abc_Cex_t *pAVar2;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  int local_38;
  int local_34;
  int k;
  int i;
  Gia_Obj_t *pObj;
  Abc_Cex_t *pNew;
  Abc_Cex_t *pCexCare_local;
  Abc_Cex_t *pCex_local;
  Gia_Man_t *p_local;
  
  if (pCex->nPis != pCexCare->nPis) {
    __assert_fail("pCex->nPis == pCexCare->nPis",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCare.c"
                  ,0x33,
                  "Abc_Cex_t *Bmc_CexCareExtendToObjects(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t *)");
  }
  if (pCex->nRegs != pCexCare->nRegs) {
    __assert_fail("pCex->nRegs == pCexCare->nRegs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCare.c"
                  ,0x34,
                  "Abc_Cex_t *Bmc_CexCareExtendToObjects(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t *)");
  }
  if (pCex->nBits != pCexCare->nBits) {
    __assert_fail("pCex->nBits == pCexCare->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCare.c"
                  ,0x35,
                  "Abc_Cex_t *Bmc_CexCareExtendToObjects(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t *)");
  }
  iVar1 = pCex->nRegs;
  nRealPis = Gia_ManObjNum(p);
  pAVar2 = Abc_CexAlloc(iVar1,nRealPis,pCex->iFrame + 1);
  pAVar2->iFrame = pCex->iFrame;
  pAVar2->iPo = pCex->iPo;
  pGVar3 = Gia_ManConst0(p);
  Gia_ObjTerSimSet0(pGVar3);
  local_38 = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar4 = false;
    if (local_38 < iVar1) {
      iVar1 = Gia_ManPoNum(p);
      _k = Gia_ManCo(p,iVar1 + local_38);
      bVar4 = _k != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    Gia_ObjTerSimSet0(_k);
    local_38 = local_38 + 1;
  }
  for (local_34 = 0; local_34 <= pCex->iFrame; local_34 = local_34 + 1) {
    local_38 = 0;
    while( true ) {
      iVar1 = Gia_ManPiNum(p);
      bVar4 = false;
      if (local_38 < iVar1) {
        _k = Gia_ManCi(p,local_38);
        bVar4 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar4) break;
      iVar1 = Abc_InfoHasBit((uint *)(pCexCare + 1),
                             pCexCare->nRegs + local_34 * pCexCare->nPis + local_38);
      if (iVar1 == 0) {
        Gia_ObjTerSimSetX(_k);
      }
      else {
        iVar1 = Abc_InfoHasBit((uint *)(pCex + 1),pCex->nRegs + local_34 * pCex->nPis + local_38);
        if (iVar1 == 0) {
          Gia_ObjTerSimSet0(_k);
        }
        else {
          Gia_ObjTerSimSet1(_k);
        }
      }
      local_38 = local_38 + 1;
    }
    local_38 = 0;
    while( true ) {
      iVar1 = Gia_ManRegNum(p);
      bVar4 = false;
      if (local_38 < iVar1) {
        iVar1 = Gia_ManPiNum(p);
        _k = Gia_ManCi(p,iVar1 + local_38);
        bVar4 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar4) break;
      Gia_ObjTerSimRo(p,_k);
      local_38 = local_38 + 1;
    }
    local_38 = 0;
    while( true ) {
      bVar4 = false;
      if (local_38 < p->nObjs) {
        _k = Gia_ManObj(p,local_38);
        bVar4 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar4) break;
      iVar1 = Gia_ObjIsAnd(_k);
      if (iVar1 != 0) {
        Gia_ObjTerSimAnd(_k);
      }
      local_38 = local_38 + 1;
    }
    local_38 = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCos);
      bVar4 = false;
      if (local_38 < iVar1) {
        _k = Gia_ManCo(p,local_38);
        bVar4 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar4) break;
      Gia_ObjTerSimCo(_k);
      local_38 = local_38 + 1;
    }
    local_38 = 0;
    while( true ) {
      bVar4 = false;
      if (local_38 < p->nObjs) {
        _k = Gia_ManObj(p,local_38);
        bVar4 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar4) break;
      iVar1 = Gia_ObjTerSimGetX(_k);
      if (iVar1 == 0) {
        Abc_InfoSetBit((uint *)(pAVar2 + 1),pAVar2->nRegs + pAVar2->nPis * local_34 + local_38);
      }
      local_38 = local_38 + 1;
    }
  }
  pGVar3 = Gia_ManPo(p,pCex->iPo);
  iVar1 = Gia_ObjTerSimGet1(pGVar3);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjTerSimGet1(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCare.c"
                  ,0x55,
                  "Abc_Cex_t *Bmc_CexCareExtendToObjects(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t *)");
  }
  return pAVar2;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Takes CEX and its care-set. Returns care-set of all objects.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Abc_Cex_t * Bmc_CexCareExtendToObjects( Gia_Man_t * p, Abc_Cex_t * pCex, Abc_Cex_t * pCexCare )
{
    Abc_Cex_t * pNew;
    Gia_Obj_t * pObj;
    int i, k;
    assert( pCex->nPis == pCexCare->nPis );
    assert( pCex->nRegs == pCexCare->nRegs );
    assert( pCex->nBits == pCexCare->nBits );
    // start the counter-example
    pNew = Abc_CexAlloc( pCex->nRegs, Gia_ManObjNum(p), pCex->iFrame + 1 );
    pNew->iFrame = pCex->iFrame;
    pNew->iPo    = pCex->iPo;
    // initialize terminary simulation
    Gia_ObjTerSimSet0( Gia_ManConst0(p) );
    Gia_ManForEachRi( p, pObj, k )
        Gia_ObjTerSimSet0( pObj );
    for ( i = 0; i <= pCex->iFrame; i++ )
    {
        Gia_ManForEachPi( p, pObj, k )
        {
            if ( !Abc_InfoHasBit( pCexCare->pData, pCexCare->nRegs + i * pCexCare->nPis + k ) )
                Gia_ObjTerSimSetX( pObj );
            else if ( Abc_InfoHasBit( pCex->pData, pCex->nRegs + i * pCex->nPis + k ) )
                Gia_ObjTerSimSet1( pObj );
            else
                Gia_ObjTerSimSet0( pObj );
        }
        Gia_ManForEachRo( p, pObj, k )
            Gia_ObjTerSimRo( p, pObj );
        Gia_ManForEachAnd( p, pObj, k )
            Gia_ObjTerSimAnd( pObj );
        Gia_ManForEachCo( p, pObj, k )
            Gia_ObjTerSimCo( pObj );
        // add cares to the exdended counter-example
        Gia_ManForEachObj( p, pObj, k )
            if ( !Gia_ObjTerSimGetX(pObj) )
                Abc_InfoSetBit( pNew->pData, pNew->nRegs + pNew->nPis * i + k );
    }
    pObj = Gia_ManPo( p, pCex->iPo );
    assert( Gia_ObjTerSimGet1(pObj) );
    return pNew;
}